

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImTextCharToUtf8(char *out_buf,uint c)

{
  int iVar1;
  uint in_ESI;
  char *in_RDI;
  int count;
  
  iVar1 = ImTextCharToUtf8_inline(in_RDI,5,in_ESI);
  in_RDI[iVar1] = '\0';
  return in_RDI;
}

Assistant:

const char* ImTextCharToUtf8(char out_buf[5], unsigned int c)
{
    int count = ImTextCharToUtf8_inline(out_buf, 5, c);
    out_buf[count] = 0;
    return out_buf;
}